

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

bool __thiscall inja::Parser::parse_expression_and(Parser *this,Template *tmpl)

{
  Token *pTVar1;
  short *psVar2;
  const_pointer pcVar3;
  undefined4 uVar4;
  bool bVar5;
  Token local_40;
  
  bVar5 = parse_expression_not(this,tmpl);
  if (bVar5) {
    if ((this->m_tok).kind != Id) {
      return true;
    }
    if ((this->m_tok).text.size_ != 3) {
      return true;
    }
    psVar2 = (short *)(this->m_tok).text.data_;
    if ((char)psVar2[1] != 'd' || *psVar2 != 0x6e61) {
      return true;
    }
    pTVar1 = &this->m_tok;
    if (this->m_have_peek_tok == true) {
      (this->m_tok).text.size_ = (this->m_peek_tok).text.size_;
      uVar4 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
      pcVar3 = (this->m_peek_tok).text.data_;
      pTVar1->kind = (this->m_peek_tok).kind;
      *(undefined4 *)&pTVar1->field_0x4 = uVar4;
      (this->m_tok).text.data_ = pcVar3;
      this->m_have_peek_tok = false;
    }
    else {
      Lexer::scan(&local_40,&this->m_lexer);
      (this->m_tok).text.size_ = local_40.text.size_;
      pTVar1->kind = local_40.kind;
      *(undefined4 *)&pTVar1->field_0x4 = local_40._4_4_;
      (this->m_tok).text.data_ = local_40.text.data_;
    }
    bVar5 = parse_expression_not(this,tmpl);
    if (bVar5) {
      append_function(this,tmpl,And,2);
      return true;
    }
  }
  return false;
}

Assistant:

bool parse_expression_and(Template& tmpl) {
		if (!parse_expression_not(tmpl)) return false;
		if (m_tok.kind != Token::Kind::Id || m_tok.text != "and") return true;
		get_next_token();
		if (!parse_expression_not(tmpl)) return false;
		append_function(tmpl, Bytecode::Op::And, 2);
		return true;
	}